

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall absl::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  uint uVar1;
  Rep *pRVar2;
  Node *pNVar3;
  Node *pNVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  NodeSet ranks;
  
  pRVar2 = this->rep_;
  anon_unknown_0::NodeSet::NodeSet(&ranks);
  if ((pRVar2->nodes_).size_ == 0) {
LAB_00145e64:
    anon_unknown_0::Vec<int>::~Vec(&ranks.table_);
    return true;
  }
  uVar7 = 0;
LAB_00145cd7:
  pNVar3 = (pRVar2->nodes_).ptr_[uVar7];
  if (pNVar3->masked_ptr != 0xf03a5f7bf03a5f7b) {
    uVar8 = pNVar3->masked_ptr ^ 0xf03a5f7bf03a5f7b;
    uVar10 = (pRVar2->ptrmap_).table_._M_elems[(uint)((int)uVar8 + (int)(uVar8 / 0x1feb) * -0x1feb)]
    ;
    if (uVar10 == 0xffffffff) {
      uVar8 = 0xffffffff;
    }
    else {
      do {
        pNVar4 = ((pRVar2->ptrmap_).nodes_)->ptr_[uVar10];
        if ((pNVar4->masked_ptr ^ uVar8) == 0xf03a5f7bf03a5f7b) goto LAB_00145d51;
        uVar10 = pNVar4->next_hash;
      } while (uVar10 != 0xffffffff);
      uVar10 = 0xffffffff;
LAB_00145d51:
      uVar8 = (ulong)uVar10;
    }
    if (uVar8 != uVar7) {
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",0x183,"Did not find live node in hash table %u %p",
                 uVar7 & 0xffffffff);
    }
  }
  if (pNVar3->visited == true) {
    raw_logging_internal::RawLog
              (kFatal,"graphcycles.cc",0x186,"Did not clear visited marker on node %u",
               uVar7 & 0xffffffff);
  }
  bVar5 = anon_unknown_0::NodeSet::insert(&ranks,pNVar3->rank);
  if (!bVar5) {
    raw_logging_internal::RawLog
              (kFatal,"graphcycles.cc",0x189,"Duplicate occurrence of rank %d",
               (ulong)(uint)pNVar3->rank);
  }
  uVar10 = 0;
  do {
    uVar1 = (pNVar3->out).table_.size_;
    if (uVar1 < uVar10) {
      uVar1 = uVar10;
    }
    lVar6 = 0;
    do {
      if ((ulong)uVar1 - (ulong)uVar10 == lVar6) {
        uVar7 = uVar7 + 1;
        if ((pRVar2->nodes_).size_ <= uVar7) goto LAB_00145e64;
        goto LAB_00145cd7;
      }
      lVar9 = (long)(pNVar3->out).table_.ptr_[(ulong)uVar10 + lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar9 < 0);
    uVar1 = (pRVar2->nodes_).ptr_[lVar9]->rank;
    if ((int)uVar1 <= pNVar3->rank) {
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",399,"Edge %u->%d has bad rank assignment %d->%d",
                 uVar7 & 0xffffffff,lVar9,(ulong)(uint)pNVar3->rank,(ulong)uVar1);
    }
    uVar10 = uVar10 + (int)lVar6;
  } while( true );
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %u %p", x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %u", x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %d", nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[y];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL, "Edge %u->%d has bad rank assignment %d->%d", x, y,
                     nx->rank, ny->rank);
      }
    }
  }
  return true;
}